

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uenum.cpp
# Opt level: O0

void uenum_reset_63(UEnumeration *en,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  UEnumeration *en_local;
  
  if ((en != (UEnumeration *)0x0) && (UVar1 = U_FAILURE(*status), UVar1 == '\0')) {
    if (en->reset == (UEnumReset *)0x0) {
      *status = U_UNSUPPORTED_ERROR;
    }
    else {
      (*en->reset)(en,status);
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uenum_reset(UEnumeration* en, UErrorCode* status)
{
    if (!en || U_FAILURE(*status)) {
        return;
    }
    if (en->reset != NULL) {
        en->reset(en, status);
    } else {
        *status = U_UNSUPPORTED_ERROR;
    }
}